

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall argo::json::find(json *this,pointer *p)

{
  bool bVar1;
  type_t tVar2;
  list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *this_00;
  reference ptVar3;
  string *__x;
  pointer ppVar4;
  size_t sVar5;
  size_type sVar6;
  const_reference this_01;
  json_exception *pjVar7;
  _Self local_88;
  _Self local_80;
  const_iterator i;
  undefined1 local_68 [8];
  token t;
  const_iterator __end1;
  const_iterator __begin1;
  list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *__range1;
  json *res;
  pointer *p_local;
  json *this_local;
  
  this_00 = pointer::get_path_abi_cxx11_(p);
  __end1 = std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::begin
                     (this_00);
  t.m_index = (size_t)std::__cxx11::
                      list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::end
                                (this_00);
  __range1 = (list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *)this;
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&t.m_index);
    if (!bVar1) {
      return (json *)__range1;
    }
    ptVar3 = std::_List_const_iterator<argo::pointer::token>::operator*(&__end1);
    pointer::token::token((token *)local_68,ptVar3);
    tVar2 = pointer::token::get_type((token *)local_68);
    if (tVar2 != all_e) {
      if (tVar2 == object_e) {
        if (*(int *)&(__range1->
                     super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>).
                     _M_impl._M_node.super__List_node_base._M_next != 0) {
          pjVar7 = (json_exception *)__cxa_allocate_exception(0xd8);
          json_exception::json_exception(pjVar7,pointer_not_matched_e);
          __cxa_throw(pjVar7,&json_exception::typeinfo,json_exception::~json_exception);
        }
        __x = pointer::token::get_name_abi_cxx11_((token *)local_68);
        local_80._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
                     *)&(__range1->
                        super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>
                        )._M_impl._M_node.super__List_node_base._M_prev,__x);
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
                    *)&(__range1->
                       super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>
                       )._M_impl._M_node.super__List_node_base._M_prev);
        bVar1 = std::operator==(&local_80,&local_88);
        if (bVar1) {
          pjVar7 = (json_exception *)__cxa_allocate_exception(0xd8);
          json_exception::json_exception(pjVar7,pointer_not_matched_e);
          __cxa_throw(pjVar7,&json_exception::typeinfo,json_exception::~json_exception);
        }
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                 ::operator->(&local_80);
        __range1 = (list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *)
                   std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::get
                             (&ppVar4->second);
      }
      else {
        if (tVar2 != array_e) {
          pjVar7 = (json_exception *)__cxa_allocate_exception(0xd8);
          json_exception::json_exception(pjVar7,pointer_token_type_invalid_e);
          __cxa_throw(pjVar7,&json_exception::typeinfo,json_exception::~json_exception);
        }
        if (*(int *)&(__range1->
                     super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>).
                     _M_impl._M_node.super__List_node_base._M_next != 1) {
          pjVar7 = (json_exception *)__cxa_allocate_exception(0xd8);
          json_exception::json_exception(pjVar7,pointer_not_matched_e);
          __cxa_throw(pjVar7,&json_exception::typeinfo,json_exception::~json_exception);
        }
        sVar5 = pointer::token::get_index((token *)local_68);
        sVar6 = std::
                vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                ::size((vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                        *)&(__range1->
                           super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>
                           )._M_impl._M_node.super__List_node_base._M_prev);
        if (sVar6 <= sVar5) {
          pjVar7 = (json_exception *)__cxa_allocate_exception(0xd8);
          json_exception::json_exception(pjVar7,pointer_not_matched_e);
          __cxa_throw(pjVar7,&json_exception::typeinfo,json_exception::~json_exception);
        }
        sVar5 = pointer::token::get_index((token *)local_68);
        this_01 = std::
                  vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                  ::operator[]((vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                                *)&(__range1->
                                   super__List_base<argo::pointer::token,_std::allocator<argo::pointer::token>_>
                                   )._M_impl._M_node.super__List_node_base._M_prev,sVar5);
        __range1 = (list<argo::pointer::token,_std::allocator<argo::pointer::token>_> *)
                   std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::get(this_01);
      }
    }
    pointer::token::~token((token *)local_68);
    std::_List_const_iterator<argo::pointer::token>::operator++(&__end1);
  } while( true );
}

Assistant:

const json &json::find(const pointer &p) const
{
    const json *res = this;

    for (auto t : p.get_path())
    {
        switch (t.get_type())
        {
        case pointer::token::all_e:
            break;

        case pointer::token::object_e:
            if (res->m_type == object_e)
            {
                auto i = res->m_value.u_object.find(t.get_name());
                if (i == res->m_value.u_object.end())
                {
                    throw json_exception(json_exception::pointer_not_matched_e);
                }
                else
                {
                    res = i->second.get();
                }
            }
            else
            {
                throw json_exception(json_exception::pointer_not_matched_e);
            }
            break;

        case pointer::token::array_e:
            if (res->m_type == array_e)
            {
                if (t.get_index() < res->m_value.u_array.size())
                {
                    res = (res->m_value.u_array)[t.get_index()].get();
                }
                else
                {
                    throw json_exception(json_exception::pointer_not_matched_e);
                }
            }
            else
            {
                throw json_exception(json_exception::pointer_not_matched_e);
            }
            break;

        default:
            throw json_exception(json_exception::pointer_token_type_invalid_e);
        }
    }

    return *res;
}